

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O0

int __thiscall QFontEngineFT::glyphCount(QFontEngineFT *this)

{
  FT_Face_conflict pFVar1;
  FT_Face_conflict face;
  int count;
  undefined8 in_stack_ffffffffffffffe8;
  uint in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = 0;
  pFVar1 = lockFace((QFontEngineFT *)(ulong)in_stack_fffffffffffffff0,
                    (Scaling)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (pFVar1 != (FT_Face_conflict)0x0) {
    iVar2 = (int)pFVar1->num_glyphs;
    unlockFace((QFontEngineFT *)0xa6850a);
  }
  return iVar2;
}

Assistant:

int QFontEngineFT::glyphCount() const
{
    int count = 0;
    FT_Face face = lockFace();
    if (face) {
        count = face->num_glyphs;
        unlockFace();
    }
    return count;
}